

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

Struct * __thiscall
spvtools::opt::InstrumentPass::GetStruct
          (InstrumentPass *this,
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          *fields)

{
  int iVar1;
  IRContext *this_00;
  TypeManager *this_01;
  Type *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar3;
  Type *type;
  Struct s;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *fields_local;
  InstrumentPass *this_local;
  
  s.element_decorations_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)fields;
  analysis::Struct::Struct((Struct *)&type,fields);
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_type_mgr(this_00);
  pTVar2 = analysis::TypeManager::GetRegisteredType(this_01,(Type *)&type);
  bVar3 = false;
  if (pTVar2 != (Type *)0x0) {
    iVar1 = (*pTVar2->_vptr_Type[0x1b])();
    bVar3 = CONCAT44(extraout_var,iVar1) != 0;
  }
  if (!bVar3) {
    __assert_fail("type && type->AsStruct()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instrument_pass.cpp"
                  ,0x18a,
                  "analysis::Struct *spvtools::opt::InstrumentPass::GetStruct(const std::vector<const analysis::Type *> &)"
                 );
  }
  iVar1 = (*pTVar2->_vptr_Type[0x1b])();
  analysis::Struct::~Struct((Struct *)&type);
  return (Struct *)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

analysis::Struct* InstrumentPass::GetStruct(
    const std::vector<const analysis::Type*>& fields) {
  analysis::Struct s(fields);
  analysis::Type* type = context()->get_type_mgr()->GetRegisteredType(&s);
  assert(type && type->AsStruct());
  return type->AsStruct();
}